

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O2

StatusCode __thiscall HttpConn::parseBody(HttpConn *this)

{
  int iVar1;
  mapped_type *pmVar2;
  pointer pcVar3;
  StatusCode SVar4;
  key_type local_70;
  key_type local_50;
  allocator local_2a;
  allocator local_29;
  
  std::__cxx11::string::string((string *)&local_50,"Content-Length",&local_2a);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->headers_,&local_50);
  SVar4 = Wait;
  iVar1 = 0;
  if (pmVar2->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_70,"Content-Length",&local_29);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->headers_,&local_70);
    iVar1 = std::__cxx11::stoi(pmVar2,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&local_50);
  if (this->checked_idx_ + iVar1 <= this->read_idx_) {
    pcVar3 = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + this->checked_idx_;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar3,pcVar3 + iVar1);
    std::__cxx11::string::operator=((string *)&this->requestBody_,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    this->checked_idx_ = this->checked_idx_ + iVar1;
    SVar4 = OK;
  }
  return SVar4;
}

Assistant:

HttpConn::StatusCode HttpConn::parseBody() {
    int contentLen = headers_["Content-Length"].empty() ? 0 : std::stoi(headers_["Content-Length"]);
    if (read_idx_ >= contentLen + checked_idx_) {
        requestBody_ = std::string(readBuff_.data() + checked_idx_, readBuff_.data() + checked_idx_ + contentLen);
        checked_idx_ += contentLen;
        return OK;
    } 
    else return Wait;
}